

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O2

void __thiscall
S2ClosestEdgeQueryBase<S2MaxDistance>::FindClosestEdgesInternal
          (S2ClosestEdgeQueryBase<S2MaxDistance> *this,Target *target,Options *options)

{
  double dVar1;
  value_type_conflict2 vVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  template_ElementType<2L> *ptVar6;
  bool bVar7;
  byte bVar8;
  S1ChordAngle SVar9;
  S1ChordAngle SVar10;
  iterator iVar11;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  double local_60;
  Result local_58;
  btree_set<int,_std::less<int>,_std::allocator<int>,_256> shape_ids;
  
  this->target_ = target;
  this->options_ = options;
  gtl::
  dense_hashtable<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::Identity,_gtl::dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>::SetKey,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
  ::clear(&(this->tested_edges_).rep);
  (this->distance_limit_).distance_.length2_ = (options->max_distance_).distance_.length2_;
  SVar9 = S1ChordAngle::Negative();
  (this->result_singleton_).distance_.distance_.length2_ = SVar9.length2_;
  (this->result_singleton_).shape_id_ = -1;
  (this->result_singleton_).edge_id_ = -1;
  if ((this->result_vector_).
      super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->result_vector_).
      super__Vector_base<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if ((this->result_set_).
        super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>_>
        .
        super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>_>
        .tree_.size_ == 0) {
      iVar4 = (*target->_vptr_S2DistanceTarget[8])(target);
      if (-1 < iVar4) {
        dVar1 = (this->distance_limit_).distance_.length2_;
        SVar9 = S1ChordAngle::Straight();
        if ((dVar1 != SVar9.length2_) || (NAN(dVar1) || NAN(SVar9.length2_))) {
          if (options->max_results_ == 0x7fffffff) {
            dVar1 = (options->max_distance_).distance_.length2_;
            SVar9 = S1ChordAngle::Negative();
            if ((dVar1 == SVar9.length2_) && (!NAN(dVar1) && !NAN(SVar9.length2_))) {
              S2LogMessage::S2LogMessage
                        ((S2LogMessage *)&local_80,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
                         ,0x235,kWarning,(ostream *)&std::cerr);
              std::operator<<((ostream *)local_80._8_8_,
                              "Returning all edges (max_results/max_distance not set)");
              S2LogMessage::~S2LogMessage((S2LogMessage *)&local_80);
            }
          }
          if (options->include_interiors_ == true) {
            local_80._M_unused._M_object = &shape_ids;
            shape_ids.
            super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
            .
            super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
            .tree_.root_.
            super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
            .
            super_Storage<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_2UL,_false>
            .value = (CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                      )(Storage<absl::container_internal::CompressedTuple<std::less<int>,_std::allocator<int>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_*>,_2UL,_false>
                        )0x0;
            shape_ids.
            super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
            .
            super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
            .tree_.rightmost_ = (node_type *)0x0;
            shape_ids.
            super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
            .
            super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
            .tree_.size_ = 0;
            local_68 = std::
                       _Function_handler<bool_(S2Shape_*,_const_Vector3<double>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h:571:18)>
                       ::_M_invoke;
            local_70 = std::
                       _Function_handler<bool_(S2Shape_*,_const_Vector3<double>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h:571:18)>
                       ::_M_manager;
            local_80._8_8_ = options;
            (*target->_vptr_S2DistanceTarget[6])(target,this->index_);
            std::_Function_base::~_Function_base((_Function_base *)&local_80);
            iVar11 = gtl::internal_btree::
                     btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                     ::begin((btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                              *)&shape_ids);
            local_80._M_unused._0_8_ = (undefined8)iVar11.node;
            local_80._8_4_ = iVar11.position;
            iVar11 = gtl::internal_btree::
                     btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                     ::end((btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                            *)&shape_ids);
            while (uVar3 = local_80._8_4_,
                  local_80._8_4_ != iVar11.position ||
                  (btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                   *)local_80._M_unused._0_8_ != iVar11.node) {
              ptVar6 = gtl::internal_btree::
                       btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                       ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                       *)local_80._M_unused._0_8_);
              vVar2 = ptVar6[(int)uVar3].value;
              local_58.distance_.distance_ = S1ChordAngle::Straight();
              local_58.edge_id_ = -1;
              local_58.shape_id_ = vVar2;
              AddResult(this,&local_58);
              gtl::internal_btree::
              btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
              ::increment((btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
                           *)&local_80);
            }
            dVar1 = (this->distance_limit_).distance_.length2_;
            local_60 = (double)S1ChordAngle::Straight();
            gtl::internal_btree::
            btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
            ::~btree((btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
                      *)&shape_ids);
            if ((dVar1 == local_60) && (!NAN(dVar1) && !NAN(local_60))) {
              return;
            }
          }
          dVar1 = (options->max_error_).length2_;
          SVar9 = S1ChordAngle::Zero();
          if ((dVar1 != SVar9.length2_) || (NAN(dVar1) || NAN(SVar9.length2_))) {
            local_80._M_unused._0_8_ = (undefined8)(options->max_error_).length2_;
            iVar4 = (*this->target_->_vptr_S2DistanceTarget[7])();
            bVar8 = 0;
            bVar7 = false;
            if ((char)iVar4 != '\0') {
              dVar1 = (this->distance_limit_).distance_.length2_;
              SVar9 = S1ChordAngle::Negative();
              bVar8 = 1;
              bVar7 = true;
              if ((dVar1 != SVar9.length2_) || (NAN(dVar1) || NAN(SVar9.length2_))) {
                SVar9 = S1ChordAngle::Straight();
                SVar10 = operator+((this->distance_limit_).distance_.length2_,
                                   (options->max_error_).length2_);
                bVar7 = SVar10.length2_ < SVar9.length2_;
                bVar8 = 1;
              }
            }
          }
          else {
            bVar8 = 0;
            bVar7 = false;
          }
          this->use_conservative_cell_distance_ = bVar7;
          iVar5 = (*this->target_->_vptr_S2DistanceTarget[8])();
          iVar4 = this->index_num_edges_;
          if (this->index_num_edges_limit_ <= iVar4 && this->index_num_edges_limit_ <= iVar5) {
            iVar4 = s2shapeutil::CountEdgesUpTo<S2ShapeIndex>(this->index_,iVar5 + 1);
            this->index_num_edges_ = iVar4;
            this->index_num_edges_limit_ = iVar5 + 1;
          }
          if ((options->use_brute_force_ == false) && (iVar5 < iVar4)) {
            this->avoid_duplicates_ = (bool)(bVar8 & 1 < options->max_results_);
            FindClosestEdgesOptimized(this);
          }
          else {
            this->avoid_duplicates_ = false;
            FindClosestEdgesBruteForce(this);
          }
        }
        return;
      }
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
                 ,0x230,kFatal,(ostream *)&std::cerr);
      std::operator<<((ostream *)local_80._8_8_,
                      "Check failed: (target->max_brute_force_index_size()) >= (0) ");
    }
    else {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_80,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
                 ,0x22f,kFatal,(ostream *)&std::cerr);
      std::operator<<((ostream *)local_80._8_8_,"Check failed: result_set_.empty() ");
    }
  }
  else {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_80,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
               ,0x22e,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)local_80._8_8_,"Check failed: result_vector_.empty() ");
  }
  abort();
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::FindClosestEdgesInternal(
    Target* target, const Options& options) {
  target_ = target;
  options_ = &options;

  tested_edges_.clear();
  distance_limit_ = options.max_distance();
  result_singleton_ = Result();
  S2_DCHECK(result_vector_.empty());
  S2_DCHECK(result_set_.empty());
  S2_DCHECK_GE(target->max_brute_force_index_size(), 0);
  if (distance_limit_ == Distance::Zero()) return;

  if (options.max_results() == Options::kMaxMaxResults &&
      options.max_distance() == Distance::Infinity()) {
    S2_LOG(WARNING) << "Returning all edges (max_results/max_distance not set)";
  }

  if (options.include_interiors()) {
    gtl::btree_set<int32> shape_ids;
    (void) target->VisitContainingShapes(
        *index_, [&shape_ids, &options](S2Shape* containing_shape,
                                        const S2Point& target_point) {
          shape_ids.insert(containing_shape->id());
          return shape_ids.size() < options.max_results();
        });
    for (int shape_id : shape_ids) {
      AddResult(Result(Distance::Zero(), shape_id, -1));
    }
    if (distance_limit_ == Distance::Zero()) return;
  }

  // If max_error() > 0 and the target takes advantage of this, then we may
  // need to adjust the distance estimates to the priority queue cells to
  // ensure that they are always a lower bound on the true distance.  For
  // example, suppose max_distance == 100, max_error == 30, and we compute the
  // distance to the target from some cell C0 as d(C0) == 80.  Then because
  // the target takes advantage of max_error(), the true distance could be as
  // low as 50.  In order not to miss edges contained by such cells, we need
  // to subtract max_error() from the distance estimates.  This behavior is
  // controlled by the use_conservative_cell_distance_ flag.
  //
  // However there is one important case where this adjustment is not
  // necessary, namely when max_distance() < max_error().  This is because
  // max_error() only affects the algorithm once at least max_results() edges
  // have been found that satisfy the given distance limit.  At that point,
  // max_error() is subtracted from distance_limit_ in order to ensure that
  // any further matches are closer by at least that amount.  But when
  // max_distance() < max_error(), this reduces the distance limit to 0,
  // i.e. all remaining candidate cells and edges can safely be discarded.
  // (Note that this is how IsDistanceLess() and friends are implemented.)
  //
  // Note that Distance::Delta only supports operator==.
  bool target_uses_max_error = (!(options.max_error() == Delta::Zero()) &&
                                target_->set_max_error(options.max_error()));

  // Note that we can't compare max_error() and distance_limit_ directly
  // because one is a Delta and one is a Distance.  Instead we subtract them.
  use_conservative_cell_distance_ = target_uses_max_error &&
      (distance_limit_ == Distance::Infinity() ||
       Distance::Zero() < distance_limit_ - options.max_error());

  // Use the brute force algorithm if the index is small enough.  To avoid
  // spending too much time counting edges when there are many shapes, we stop
  // counting once there are too many edges.  We may need to recount the edges
  // if we later see a target with a larger brute force edge threshold.
  int min_optimized_edges = target_->max_brute_force_index_size() + 1;
  if (min_optimized_edges > index_num_edges_limit_ &&
      index_num_edges_ >= index_num_edges_limit_) {
    index_num_edges_ = s2shapeutil::CountEdgesUpTo(*index_,
                                                   min_optimized_edges);
    index_num_edges_limit_ = min_optimized_edges;
  }

  if (options.use_brute_force() || index_num_edges_ < min_optimized_edges) {
    // The brute force algorithm considers each edge exactly once.
    avoid_duplicates_ = false;
    FindClosestEdgesBruteForce();
  } else {
    // If the target takes advantage of max_error() then we need to avoid
    // duplicate edges explicitly.  (Otherwise it happens automatically.)
    avoid_duplicates_ = (target_uses_max_error && options.max_results() > 1);
    FindClosestEdgesOptimized();
  }
}